

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_orm.h
# Opt level: O1

string * __thiscall
sqlite_orm::internal::
table_t<relive::Stream,sqlite_orm::internal::column_t<relive::Stream,long,long_const&(relive::Stream::*)()const,void(relive::Stream::*)(long),sqlite_orm::constraints::autoincrement_t,sqlite_orm::constraints::primary_key_t<>>,sqlite_orm::internal::column_t<relive::Stream,long,long_const&(relive::Stream::*)()const,void(relive::Stream::*)(long)>,sqlite_orm::internal::column_t<relive::Stream,long,long_const&(relive::Stream::*)()const,void(relive::Stream::*)(long)>,sqlite_orm::internal::column_t<relive::Stream,std::__cxx11::string,std::__cxx11::string_const&(relive::Stream::*)()const,void(relive::Stream::*)(std::__cxx11::string)>,sqlite_orm::internal::column_t<relive::Stream,std::__cxx11::string,std::__cxx11::string_const&(relive::Stream::*)()const,void(relive::Stream::*)(std::__cxx11::string)>,sqlite_orm::internal::column_t<relive::Stream,std::__cxx11::string,std::__cxx11::string_const&(relive::Stream::*)()const,void(relive::Stream::*)(std::__cxx11::string)>,sqlite_orm::internal::column_t<...:constraints::foreign_key_t<std::tuple<long_relive::Stream::*>,std::tuple<long_relive::Station::*>>>
::find_column_name<long,relive::Stream,void>
          (string *__return_storage_ptr__,void *this,offset_in_Stream_to_long m)

{
  iterator<14ul,sqlite_orm::internal::column_t<relive::Stream,long,long_const&(relive::Stream::*)()const,void(relive::Stream::*)(long),sqlite_orm::constraints::autoincrement_t,sqlite_orm::constraints::primary_key_t<>>,sqlite_orm::internal::column_t<relive::Stream,long,long_const&(relive::Stream::*)()const,void(relive::Stream::*)(long)>,sqlite_orm::internal::column_t<relive::Stream,long,long_const&(relive::Stream::*)()const,void(relive::Stream::*)(long)>,sqlite_orm::internal::column_t<relive::Stream,std::__cxx11::string,std::__cxx11::string_const&(relive::Stream::*)()const,void(relive::Stream::*)(std::__cxx11::string)>,sqlite_orm::internal::column_t<relive::Stream,std::__cxx11::string,std::__cxx11::string_const&(relive::Stream::*)()const,void(relive::Stream::*)(std::__cxx11::string)>,sqlite_orm::internal::column_t<relive::Stream,std::__cxx11::string,std::__cxx11::string_const&(relive::Stream::*)()const,void(relive::Stream::*)(std::__cxx11::string)>,sqlite_orm::internal::column_t<relive::S___:constraints::foreign_key_t<std::tuple<long_relive::Stream::*>,std::tuple<long_relive::Station::*>>>
  local_31;
  anon_class_8_1_54a3980c local_30;
  anon_class_16_2_de34c1f6 local_28;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_30.l = &local_28;
  local_28.res = __return_storage_ptr__;
  local_28.m = m;
  tuple_helper::
  iterator<14ul,sqlite_orm::internal::column_t<relive::Stream,long,long_const&(relive::Stream::*)()const,void(relive::Stream::*)(long),sqlite_orm::constraints::autoincrement_t,sqlite_orm::constraints::primary_key_t<>>,sqlite_orm::internal::column_t<relive::Stream,long,long_const&(relive::Stream::*)()const,void(relive::Stream::*)(long)>,sqlite_orm::internal::column_t<relive::Stream,long,long_const&(relive::Stream::*)()const,void(relive::Stream::*)(long)>,sqlite_orm::internal::column_t<relive::Stream,std::__cxx11::string,std::__cxx11::string_const&(relive::Stream::*)()const,void(relive::Stream::*)(std::__cxx11::string)>,sqlite_orm::internal::column_t<relive::Stream,std::__cxx11::string,std::__cxx11::string_const&(relive::Stream::*)()const,void(relive::Stream::*)(std::__cxx11::string)>,sqlite_orm::internal::column_t<relive::Stream,std::__cxx11::string,std::__cxx11::string_const&(relive::Stream::*)()const,void(relive::Stream::*)(std::__cxx11::string)>,sqlite_orm::internal::column_t<relive::S...:constraints::foreign_key_t<std::tuple<long_relive::Stream::*>,std::tuple<long_relive::Station::*>>>
  ::operator()(&local_31,(tuple<_b35031e6_> *)((long)this + 0x28),&local_30,false);
  return __return_storage_ptr__;
}

Assistant:

std::string find_column_name(F O::*m) const {
        std::string res;
        this->template for_each_column_with_field_type<F>([&res, m](auto &c) {
          if(c.member_pointer == m) {
              res = c.name;
          }
        });
        return res;
    }